

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  bool bVar5;
  connectdata *conn_00;
  _Bool _Var6;
  CURLcode CVar7;
  int iVar8;
  curl_off_t cVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  CURLcode unaff_EBP;
  Curl_easy *data;
  long lVar13;
  char *pcVar14;
  char *value;
  char *name;
  char *local_58;
  char *local_50;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  pcVar14 = (pCVar2->state).up.path;
  lVar13 = 1;
  pcVar12 = pcVar14;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar10 = pcVar12;
    pcVar12 = pcVar10 + 1;
    _Var6 = imap_is_bchar(pcVar10[1]);
    lVar13 = lVar13 + -1;
  } while (_Var6);
  if (lVar13 == 0) {
    *(undefined8 *)((long)pvVar3 + 8) = 0;
LAB_00129a98:
    while (*pcVar12 == ';') {
      pcVar14 = pcVar12 + 1;
      sVar11 = 0;
      pcVar12 = pcVar14;
LAB_00129aa9:
      if (*pcVar12 == '\0') goto LAB_00129bf6;
      if (*pcVar12 != '=') goto code_r0x00129aba;
      bVar5 = false;
      CVar7 = Curl_urldecode(pCVar2,pcVar14,sVar11,&local_50,(size_t *)0x0,REJECT_CTRL);
      if (CVar7 != CURLE_OK) goto LAB_00129bfe;
      pcVar14 = pcVar12 + 1;
      sVar11 = 0xffffffffffffffff;
      do {
        pcVar10 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
        _Var6 = imap_is_bchar(*pcVar10);
        sVar11 = sVar11 + 1;
      } while (_Var6);
      CVar7 = Curl_urldecode(pCVar2,pcVar14,sVar11,&local_58,&local_48,REJECT_CTRL);
      if (CVar7 == CURLE_OK) {
        iVar8 = Curl_strcasecompare(local_50,"UIDVALIDITY");
        if ((iVar8 == 0) || (*(long *)((long)pvVar3 + 0x10) != 0)) {
          iVar8 = Curl_strcasecompare(local_50,"UID");
          if ((iVar8 == 0) || (*(long *)((long)pvVar3 + 0x18) != 0)) {
            iVar8 = Curl_strcasecompare(local_50,"MAILINDEX");
            if ((iVar8 == 0) || (*(long *)((long)pvVar3 + 0x20) != 0)) {
              iVar8 = Curl_strcasecompare(local_50,"SECTION");
              if ((iVar8 == 0) || (*(long *)((long)pvVar3 + 0x28) != 0)) {
                iVar8 = Curl_strcasecompare(local_50,"PARTIAL");
                if ((iVar8 == 0) || (*(long *)((long)pvVar3 + 0x30) != 0)) {
                  (*Curl_cfree)(local_50);
                  (*Curl_cfree)(local_58);
LAB_00129bf6:
                  bVar5 = false;
                  CVar7 = CURLE_URL_MALFORMAT;
                  goto LAB_00129bfe;
                }
                if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                  local_58[local_48 - 1] = '\0';
                }
                *(char **)((long)pvVar3 + 0x30) = local_58;
              }
              else {
                if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                  local_58[local_48 - 1] = '\0';
                }
                *(char **)((long)pvVar3 + 0x28) = local_58;
              }
            }
            else {
              if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
                local_58[local_48 - 1] = '\0';
              }
              *(char **)((long)pvVar3 + 0x20) = local_58;
            }
          }
          else {
            if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
              local_58[local_48 - 1] = '\0';
            }
            *(char **)((long)pvVar3 + 0x18) = local_58;
          }
        }
        else {
          if ((local_48 != 0) && (local_58[local_48 - 1] == '/')) {
            local_58[local_48 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x10) = local_58;
        }
        local_58 = (char *)0x0;
        (*Curl_cfree)(local_50);
        (*Curl_cfree)(local_58);
        bVar5 = true;
        CVar7 = unaff_EBP;
      }
      else {
        (*Curl_cfree)(local_50);
        bVar5 = false;
      }
LAB_00129bfe:
      unaff_EBP = CVar7;
      if (!bVar5) goto LAB_00129d26;
    }
    if (((*(long *)((long)pvVar3 + 8) != 0) && (*(long *)((long)pvVar3 + 0x18) == 0)) &&
       (*(long *)((long)pvVar3 + 0x20) == 0)) {
      curl_url_get((pCVar2->state).uh,CURLUPART_QUERY,(char **)((long)pvVar3 + 0x38),0x40);
    }
    unaff_EBP = (uint)(*pcVar12 != '\0') * 3;
  }
  else {
    pcVar14 = pcVar14 + 1;
    if (*pcVar10 != '/') {
      pcVar10 = pcVar12;
    }
    unaff_EBP = Curl_urldecode(pCVar2,pcVar14,(long)pcVar10 - (long)pcVar14,
                               (char **)((long)pvVar3 + 8),(size_t *)0x0,REJECT_CTRL);
    if (unaff_EBP == CURLE_OK) goto LAB_00129a98;
  }
LAB_00129d26:
  conn_00 = local_38;
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pCVar2 = local_38->data;
  pcVar14 = (pCVar2->set).str[6];
  if (pcVar14 == (char *)0x0) {
LAB_00129d85:
    CVar7 = CURLE_OK;
  }
  else {
    pvVar3 = (pCVar2->req).protop;
    CVar7 = Curl_urldecode(pCVar2,pcVar14,0,(char **)((long)pvVar3 + 0x40),(size_t *)0x0,REJECT_CTRL
                          );
    if (CVar7 == CURLE_OK) {
      pcVar14 = *(char **)((long)pvVar3 + 0x40);
      for (pcVar12 = pcVar14; *pcVar12 != '\0'; pcVar12 = pcVar12 + 1) {
        if (*pcVar12 == ' ') {
          pcVar12 = (*Curl_cstrdup)(pcVar12);
          *(char **)((long)pvVar3 + 0x48) = pcVar12;
          *pcVar14 = '\0';
          CVar7 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)pvVar3 + 0x48) != 0) {
            CVar7 = CURLE_OK;
          }
          goto LAB_00129d87;
        }
        pcVar14 = pcVar14 + 1;
      }
      goto LAB_00129d85;
    }
  }
LAB_00129d87:
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  pCVar2 = conn_00->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn_00->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if (((pCVar2->set).field_0x97b & 0x10) != 0) {
    *puVar4 = 1;
  }
  *local_40 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar14 = (conn_00->proto).imapc.mailbox, pcVar14 == (char *)0x0)) ||
      (iVar8 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar14), iVar8 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar14 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar14 != (char *)0x0)) &&
      (iVar8 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar14), iVar8 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  data = conn_00->data;
  if ((((data->set).field_0x97b & 0x20) == 0) && ((pCVar2->set).mimepost.kind == MIMEKIND_NONE)) {
    lVar13 = *(long *)(puVar4 + 0x10);
    if ((lVar13 == 0) || ((!bVar5 && (*(long *)(puVar4 + 2) != 0)))) {
      if (bVar5 && lVar13 == 0) {
        if ((*(long *)(puVar4 + 6) != 0) || (*(long *)(puVar4 + 8) != 0)) {
          CVar7 = imap_perform_fetch(conn_00);
          goto LAB_0012a0d9;
        }
        if (*(long *)(puVar4 + 0xe) != 0) {
          CVar7 = imap_perform_search(conn_00);
          goto LAB_0012a0d9;
        }
      }
      if ((!bVar5 && *(long *)(puVar4 + 2) != 0) &&
         ((((lVar13 != 0 || (*(long *)(puVar4 + 6) != 0)) || (*(long *)(puVar4 + 8) != 0)) ||
          (*(long *)(puVar4 + 0xe) != 0)))) {
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox);
        (conn_00->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox_uidvalidity);
        (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar14 = *(char **)((long)pvVar3 + 8);
        if (pcVar14 == (char *)0x0) {
          data = conn_00->data;
          pcVar14 = "Cannot SELECT without a mailbox.";
          goto LAB_00129fa4;
        }
        pcVar14 = imap_atom(pcVar14,false);
        if (pcVar14 != (char *)0x0) {
          CVar7 = imap_sendf(conn_00,"SELECT %s",pcVar14);
          (*Curl_cfree)(pcVar14);
          if (CVar7 == CURLE_OK) {
            (conn_00->proto).imapc.state = IMAP_SELECT;
          }
          goto LAB_0012a0d9;
        }
        goto LAB_0012a0d4;
      }
    }
    CVar7 = imap_perform_list(conn_00);
  }
  else {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar14 = "Cannot APPEND without a mailbox.";
LAB_00129fa4:
      Curl_failf(data,pcVar14);
      CVar7 = CURLE_URL_MALFORMAT;
      goto LAB_0012a0d9;
    }
    if ((data->set).mimepost.kind != MIMEKIND_NONE) {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar7 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar7 == CURLE_OK) {
        pcVar14 = Curl_checkheaders(conn_00,"Mime-Version");
        CVar7 = CURLE_OK;
        if (pcVar14 == (char *)0x0) {
          CVar7 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0");
        }
      }
      if (CVar7 == CURLE_OK) {
        CVar7 = Curl_mime_rewind(part);
      }
      if (CVar7 != CURLE_OK) goto LAB_0012a0d9;
      cVar9 = Curl_mime_size(part);
      (data->state).infilesize = cVar9;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if ((data->state).infilesize < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      CVar7 = CURLE_UPLOAD_FAILED;
      goto LAB_0012a0d9;
    }
    pcVar14 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar14 != (char *)0x0) {
      CVar7 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar14);
      (*Curl_cfree)(pcVar14);
      if (CVar7 == CURLE_OK) {
        (conn_00->proto).imapc.state = IMAP_APPEND;
      }
      goto LAB_0012a0d9;
    }
LAB_0012a0d4:
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
LAB_0012a0d9:
  if (CVar7 == CURLE_OK) {
    CVar7 = imap_multi_statemach(conn_00,local_40);
  }
  if (((CVar7 == CURLE_OK) && (CVar7 = CURLE_OK, *local_40 == true)) &&
     (*(conn_00->data->req).protop != 0)) {
    CVar7 = CURLE_OK;
    Curl_setup_transfer(conn_00->data,-1,-1,false,-1);
  }
  return CVar7;
code_r0x00129aba:
  pcVar12 = pcVar12 + 1;
  sVar11 = sVar11 + 1;
  goto LAB_00129aa9;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}